

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

IVec4 __thiscall tcu::getChannelBitDepth(tcu *this,ChannelType channelType)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  undefined8 extraout_RDX_29;
  undefined8 extraout_RDX_30;
  undefined8 extraout_RDX_31;
  undefined8 extraout_RDX_32;
  undefined8 extraout_RDX_33;
  undefined8 extraout_RDX_34;
  undefined8 extraout_RDX_35;
  undefined8 extraout_RDX_36;
  undefined8 extraout_RDX_37;
  undefined8 uVar1;
  IVec4 IVar2;
  ChannelType channelType_local;
  
  switch(channelType) {
  case SNORM_INT8:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,8);
    uVar1 = extraout_RDX;
    break;
  case SNORM_INT16:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x10);
    uVar1 = extraout_RDX_00;
    break;
  case SNORM_INT32:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x20);
    uVar1 = extraout_RDX_01;
    break;
  case UNORM_INT8:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,8);
    uVar1 = extraout_RDX_02;
    break;
  case UNORM_INT16:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x10);
    uVar1 = extraout_RDX_03;
    break;
  case UNORM_INT24:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x18);
    uVar1 = extraout_RDX_04;
    break;
  case UNORM_INT32:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x20);
    uVar1 = extraout_RDX_05;
    break;
  case UNORM_BYTE_44:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,4,4,0,0);
    uVar1 = extraout_RDX_06;
    break;
  case UNORM_SHORT_565:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,5,6,5,0);
    uVar1 = extraout_RDX_07;
    break;
  case UNORM_SHORT_555:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,5,5,5,0);
    uVar1 = extraout_RDX_09;
    break;
  case UNORM_SHORT_4444:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,4);
    uVar1 = extraout_RDX_08;
    break;
  case UNORM_SHORT_5551:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,5,5,5,1);
    uVar1 = extraout_RDX_10;
    break;
  case UNORM_SHORT_1555:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,1,5,5,5);
    uVar1 = extraout_RDX_11;
    break;
  case UNORM_INT_101010:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,10,10,10,0);
    uVar1 = extraout_RDX_16;
    break;
  case SNORM_INT_1010102_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,10,10,10,2);
    uVar1 = extraout_RDX_17;
    break;
  case UNORM_INT_1010102_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,10,10,10,2);
    uVar1 = extraout_RDX_18;
    break;
  case UNSIGNED_BYTE_44:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,4,4,0,0);
    uVar1 = extraout_RDX_12;
    break;
  case UNSIGNED_SHORT_565:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,5,6,5,0);
    uVar1 = extraout_RDX_13;
    break;
  case UNSIGNED_SHORT_4444:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,4);
    uVar1 = extraout_RDX_14;
    break;
  case UNSIGNED_SHORT_5551:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,5,5,5,1);
    uVar1 = extraout_RDX_15;
    break;
  case SIGNED_INT_1010102_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,10,10,10,2);
    uVar1 = extraout_RDX_26;
    break;
  case UNSIGNED_INT_1010102_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,10,10,10,2);
    uVar1 = extraout_RDX_27;
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0xb,0xb,10,0);
    uVar1 = extraout_RDX_34;
    break;
  case UNSIGNED_INT_999_E5_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,9,9,9,0);
    uVar1 = extraout_RDX_35;
    break;
  case UNSIGNED_INT_16_8_8:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x10,8,0,0);
    uVar1 = extraout_RDX_28;
    break;
  case UNSIGNED_INT_24_8:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x18,8,0,0);
    uVar1 = extraout_RDX_29;
    break;
  case UNSIGNED_INT_24_8_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x18,8,0,0);
    uVar1 = extraout_RDX_30;
    break;
  case SIGNED_INT8:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,8);
    uVar1 = extraout_RDX_19;
    break;
  case SIGNED_INT16:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x10);
    uVar1 = extraout_RDX_20;
    break;
  case SIGNED_INT32:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x20);
    uVar1 = extraout_RDX_21;
    break;
  case UNSIGNED_INT8:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,8);
    uVar1 = extraout_RDX_22;
    break;
  case UNSIGNED_INT16:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x10);
    uVar1 = extraout_RDX_23;
    break;
  case UNSIGNED_INT24:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x18);
    uVar1 = extraout_RDX_24;
    break;
  case UNSIGNED_INT32:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x20);
    uVar1 = extraout_RDX_25;
    break;
  case HALF_FLOAT:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x10);
    uVar1 = extraout_RDX_31;
    break;
  case FLOAT:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x20);
    uVar1 = extraout_RDX_32;
    break;
  case FLOAT64:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x40);
    uVar1 = extraout_RDX_33;
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0x20,8,0,0);
    uVar1 = extraout_RDX_36;
    break;
  default:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0);
    uVar1 = extraout_RDX_37;
  }
  IVar2.m_data[2] = (int)uVar1;
  IVar2.m_data[3] = (int)((ulong)uVar1 >> 0x20);
  IVar2.m_data._0_8_ = this;
  return (IVec4)IVar2.m_data;
}

Assistant:

static IVec4 getChannelBitDepth (TextureFormat::ChannelType channelType)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (channelType)
	{
		case TextureFormat::SNORM_INT8:						return IVec4(8);
		case TextureFormat::SNORM_INT16:					return IVec4(16);
		case TextureFormat::SNORM_INT32:					return IVec4(32);
		case TextureFormat::UNORM_INT8:						return IVec4(8);
		case TextureFormat::UNORM_INT16:					return IVec4(16);
		case TextureFormat::UNORM_INT24:					return IVec4(24);
		case TextureFormat::UNORM_INT32:					return IVec4(32);
		case TextureFormat::UNORM_BYTE_44:					return IVec4(4,4,0,0);
		case TextureFormat::UNORM_SHORT_565:				return IVec4(5,6,5,0);
		case TextureFormat::UNORM_SHORT_4444:				return IVec4(4);
		case TextureFormat::UNORM_SHORT_555:				return IVec4(5,5,5,0);
		case TextureFormat::UNORM_SHORT_5551:				return IVec4(5,5,5,1);
		case TextureFormat::UNORM_SHORT_1555:				return IVec4(1,5,5,5);
		case TextureFormat::UNSIGNED_BYTE_44:				return IVec4(4,4,0,0);
		case TextureFormat::UNSIGNED_SHORT_565:				return IVec4(5,6,5,0);
		case TextureFormat::UNSIGNED_SHORT_4444:			return IVec4(4);
		case TextureFormat::UNSIGNED_SHORT_5551:			return IVec4(5,5,5,1);
		case TextureFormat::UNORM_INT_101010:				return IVec4(10,10,10,0);
		case TextureFormat::SNORM_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::UNORM_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::SIGNED_INT8:					return IVec4(8);
		case TextureFormat::SIGNED_INT16:					return IVec4(16);
		case TextureFormat::SIGNED_INT32:					return IVec4(32);
		case TextureFormat::UNSIGNED_INT8:					return IVec4(8);
		case TextureFormat::UNSIGNED_INT16:					return IVec4(16);
		case TextureFormat::UNSIGNED_INT24:					return IVec4(24);
		case TextureFormat::UNSIGNED_INT32:					return IVec4(32);
		case TextureFormat::SIGNED_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::UNSIGNED_INT_1010102_REV:		return IVec4(10,10,10,2);
		case TextureFormat::UNSIGNED_INT_16_8_8:			return IVec4(16,8,0,0);
		case TextureFormat::UNSIGNED_INT_24_8:				return IVec4(24,8,0,0);
		case TextureFormat::UNSIGNED_INT_24_8_REV:			return IVec4(24,8,0,0);
		case TextureFormat::HALF_FLOAT:						return IVec4(16);
		case TextureFormat::FLOAT:							return IVec4(32);
		case TextureFormat::FLOAT64:						return IVec4(64);
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	return IVec4(11,11,10,0);
		case TextureFormat::UNSIGNED_INT_999_E5_REV:		return IVec4(9,9,9,0);
		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	return IVec4(32,8,0,0);
		default:
			DE_ASSERT(false);
			return IVec4(0);
	}
}